

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

Table<true,_80UL,_int,_std::unique_ptr<Rml::FontFaceHandleDefault,_std::default_delete<Rml::FontFaceHandleDefault>_>,_robin_hood::hash<int,_void>,_std::equal_to<int>_>
* __thiscall
robin_hood::detail::
Table<true,_80UL,_int,_std::unique_ptr<Rml::FontFaceHandleDefault,_std::default_delete<Rml::FontFaceHandleDefault>_>,_robin_hood::hash<int,_void>,_std::equal_to<int>_>
::operator=(Table<true,_80UL,_int,_std::unique_ptr<Rml::FontFaceHandleDefault,_std::default_delete<Rml::FontFaceHandleDefault>_>,_robin_hood::hash<int,_void>,_std::equal_to<int>_>
            *this,Table<true,_80UL,_int,_std::unique_ptr<Rml::FontFaceHandleDefault,_std::default_delete<Rml::FontFaceHandleDefault>_>,_robin_hood::hash<int,_void>,_std::equal_to<int>_>
                  *o)

{
  Table<true,_80UL,_int,_std::unique_ptr<Rml::FontFaceHandleDefault,_std::default_delete<Rml::FontFaceHandleDefault>_>,_robin_hood::hash<int,_void>,_std::equal_to<int>_>
  *ctx;
  Table<true,_80UL,_int,_std::unique_ptr<Rml::FontFaceHandleDefault,_std::default_delete<Rml::FontFaceHandleDefault>_>,_robin_hood::hash<int,_void>,_std::equal_to<int>_>
  *o_local;
  Table<true,_80UL,_int,_std::unique_ptr<Rml::FontFaceHandleDefault,_std::default_delete<Rml::FontFaceHandleDefault>_>,_robin_hood::hash<int,_void>,_std::equal_to<int>_>
  *this_local;
  
  if (o != this) {
    if (o->mMask == 0) {
      clear(this);
    }
    else {
      ctx = o;
      destroy(this);
      this->mKeyVals = o->mKeyVals;
      this->mInfo = o->mInfo;
      this->mNumElements = o->mNumElements;
      this->mMask = o->mMask;
      this->mMaxNumElementsAllowed = o->mMaxNumElementsAllowed;
      this->mInfoInc = o->mInfoInc;
      this->mInfoHashShift = o->mInfoHashShift;
      init(o,(EVP_PKEY_CTX *)ctx);
    }
  }
  return this;
}

Assistant:

Table& operator=(Table&& o) noexcept {
        ROBIN_HOOD_TRACE(this)
        if (&o != this) {
            if (o.mMask) {
                // only move stuff if the other map actually has some data
                destroy();
                mKeyVals = std::move(o.mKeyVals);
                mInfo = std::move(o.mInfo);
                mNumElements = std::move(o.mNumElements);
                mMask = std::move(o.mMask);
                mMaxNumElementsAllowed = std::move(o.mMaxNumElementsAllowed);
                mInfoInc = std::move(o.mInfoInc);
                mInfoHashShift = std::move(o.mInfoHashShift);
                WHash::operator=(std::move(static_cast<WHash&>(o)));
                WKeyEqual::operator=(std::move(static_cast<WKeyEqual&>(o)));
                DataPool::operator=(std::move(static_cast<DataPool&>(o)));

                o.init();

            } else {
                // nothing in the other map => just clear us.
                clear();
            }
        }
        return *this;
    }